

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall xray_re::xr_writer::close_chunk(xr_writer *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pvVar5;
  size_t chunk_pos;
  size_t pos;
  xr_writer *this_local;
  ulong uVar4;
  
  bVar2 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
          empty(&this->m_open_chunks);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_open_chunks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_writer.cxx"
                  ,0x15,"void xray_re::xr_writer::close_chunk()");
  }
  iVar3 = (*this->_vptr_xr_writer[4])();
  uVar4 = CONCAT44(extraout_var,iVar3);
  pvVar5 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
           top(&this->m_open_chunks);
  uVar1 = *pvVar5;
  if (uVar1 <= uVar4) {
    (*this->_vptr_xr_writer[3])(this,uVar1 - 4);
    w_size_u32(this,uVar4 - uVar1);
    (*this->_vptr_xr_writer[3])(this,uVar4);
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              (&this->m_open_chunks);
    return;
  }
  __assert_fail("chunk_pos <= pos",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_writer.cxx"
                ,0x18,"void xray_re::xr_writer::close_chunk()");
}

Assistant:

void xr_writer::close_chunk()
{
	xr_assert(!m_open_chunks.empty());
	size_t pos = tell();
	size_t chunk_pos = m_open_chunks.top();
	xr_assert(chunk_pos <= pos);
	seek(chunk_pos - 4);
	w_size_u32(pos - chunk_pos);
	seek(pos);
	m_open_chunks.pop();
}